

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

XrResult GenValidUsageNextXrApplyForceFeedbackCurlMNDX
                   (XrHandTrackerEXT handTracker,XrForceFeedbackCurlApplyLocationsMNDX *locations)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  
  pVar2 = HandleInfo<XrHandTrackerEXT_T_*>::getWithInstanceInfo(&g_handtrackerext_info,handTracker);
  XVar1 = (*(pVar2.second)->dispatch_table->ApplyForceFeedbackCurlMNDX)(handTracker,locations);
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrApplyForceFeedbackCurlMNDX(
    XrHandTrackerEXT handTracker,
    const XrForceFeedbackCurlApplyLocationsMNDX* locations) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_handtrackerext_info.getWithInstanceInfo(handTracker);
        GenValidUsageXrHandleInfo *gen_handtrackerext_info = info_with_instance.first;
        (void)gen_handtrackerext_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->ApplyForceFeedbackCurlMNDX(handTracker, locations);
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}